

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_MRS_v7m(DisasContext_conflict1 *s,arg_MRS_v7m *a)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 var;
  uint uVar1;
  uintptr_t o;
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  uVar1 = (uint)s->features;
  if ((uVar1 >> 9 & 1) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    var = tcg_const_i32_aarch64(tcg_ctx,a->sysm);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_30 = (TCGTemp *)(var + (long)&tcg_ctx->pool_cur);
    tcg_gen_callN_aarch64(tcg_ctx,helper_v7m_mrs_aarch64,local_30,2,&local_38);
    store_reg(s,a->rd,var);
  }
  return (_Bool)((byte)(uVar1 >> 9) & 1);
}

Assistant:

static bool trans_MRS_v7m(DisasContext *s, arg_MRS_v7m *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    tmp = tcg_const_i32(tcg_ctx, a->sysm);
    gen_helper_v7m_mrs(tcg_ctx, tmp, tcg_ctx->cpu_env, tmp);
    store_reg(s, a->rd, tmp);
    return true;
}